

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O2

Space KokkosTools::SpaceTimeStack::get_space(SpaceHandle *handle)

{
  int iVar1;
  Space SVar2;
  
  if (*(int *)handle->name == 0x61647543) {
    SVar2 = SPACE_CUDA;
  }
  else if (*(int *)handle->name == 0x4c435953) {
    SVar2 = SPACE_SYCL;
  }
  else {
    iVar1 = bcmp(handle,"OpenMPTarget",0xc);
    if (iVar1 == 0) {
      SVar2 = SPACE_OMPT;
    }
    else {
      iVar1 = bcmp(handle,"HIP",3);
      if (iVar1 == 0) {
        SVar2 = SPACE_HIP;
      }
      else {
        iVar1 = bcmp(handle,"Host",5);
        SVar2 = SPACE_HOST;
        if (iVar1 != 0) {
          abort();
        }
      }
    }
  }
  return SVar2;
}

Assistant:

Space get_space(SpaceHandle const& handle) {
  // check that name starts with "Cuda"
  if (strncmp(handle.name, "Cuda", 4) == 0) return SPACE_CUDA;
  // check that name starts with "SYCL"
  if (strncmp(handle.name, "SYCL", 4) == 0) return SPACE_SYCL;
  // check that name starts with "OpenMPTarget"
  if (strncmp(handle.name, "OpenMPTarget", 12) == 0) return SPACE_OMPT;
  // check that name starts with "HIP"
  if (strncmp(handle.name, "HIP", 3) == 0) return SPACE_HIP;
  if (strcmp(handle.name, "Host") == 0) return SPACE_HOST;

  abort();
  return SPACE_HOST;
}